

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O1

void sylvan_gc_aggressive_resize_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_gc_aggressive_resize *t)

{
  llmsset_t plVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  plVar1 = nodes;
  uVar5 = nodes->max_size;
  if (nodes->table_size < uVar5) {
    uVar4 = nodes->table_size * 2;
    if (uVar5 <= uVar4) {
      uVar4 = uVar5;
    }
    if (0x80 < uVar4) {
      nodes->table_size = uVar4;
      plVar1->mask = uVar4 - 1;
      LOCK();
      plVar1->threshold = (short)LZCOUNT(uVar4) * -2 + 0xc0;
      UNLOCK();
    }
  }
  sVar2 = cache_getsize();
  sVar3 = cache_getmaxsize();
  if (sVar2 < sVar3) {
    uVar5 = sVar2 * 2;
    if (sVar3 <= sVar2 * 2) {
      uVar5 = sVar3;
    }
    cache_setsize(uVar5);
    return;
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc_aggressive_resize)
{
    size_t nodes_size = llmsset_get_size(nodes);
    size_t nodes_max = llmsset_get_max_size(nodes);
    if (nodes_size < nodes_max) {
        size_t new_size = next_size(nodes_size);
        if (new_size > nodes_max) new_size = nodes_max;
        llmsset_set_size(nodes, new_size);
    }
    size_t cache_size = cache_getsize();
    size_t cache_max = cache_getmaxsize();
    if (cache_size < cache_max) {
        size_t new_size = next_size(cache_size);
        if (new_size > cache_max) new_size = cache_max;
        cache_setsize(new_size);
    }
}